

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void gen_add_insn_after(gen_ctx_t gen_ctx,MIR_insn_t after,MIR_insn_t insn)

{
  int iVar1;
  MIR_insn_t insn_for_bb;
  
  if (*(int *)&insn->field_0x18 == 0xb4) {
    __assert_fail("insn->code != MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,699,"void gen_add_insn_after(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
  }
  iVar1 = (int)*(undefined8 *)&after->field_0x18;
  if (((0xffffffd0 < iVar1 - 0xa5U) || (iVar1 == 0xaa)) || (insn_for_bb = after, iVar1 == 0xa6)) {
    insn_for_bb = (after->insn_link).next;
    iVar1 = (int)*(undefined8 *)&insn_for_bb->field_0x18;
    if (0xffffffd0 < iVar1 - 0xa5U) goto LAB_00138c69;
  }
  if ((iVar1 != 0xaa) && (iVar1 != 0xa6)) {
    MIR_insert_insn_after(gen_ctx->ctx,gen_ctx->curr_func_item,after,insn);
    create_new_bb_insns(gen_ctx,after,(insn->insn_link).next,insn_for_bb);
    return;
  }
LAB_00138c69:
  __assert_fail("!MIR_any_branch_code_p (insn_for_bb->code)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2bd,"void gen_add_insn_after(gen_ctx_t, MIR_insn_t, MIR_insn_t)");
}

Assistant:

static void gen_add_insn_after (gen_ctx_t gen_ctx, MIR_insn_t after, MIR_insn_t insn) {
  MIR_insn_t insn_for_bb = after;

  gen_assert (insn->code != MIR_LABEL);
  if (MIR_any_branch_code_p (insn_for_bb->code)) insn_for_bb = DLIST_NEXT (MIR_insn_t, insn_for_bb);
  gen_assert (!MIR_any_branch_code_p (insn_for_bb->code));
  MIR_insert_insn_after (gen_ctx->ctx, curr_func_item, after, insn);
  create_new_bb_insns (gen_ctx, after, DLIST_NEXT (MIR_insn_t, insn), insn_for_bb);
}